

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O0

symbol * evaluate_assignment(dmr_C *C,expression *expr)

{
  expression *expr_00;
  int iVar1;
  symbol *ltype;
  expression *where;
  expression *left;
  expression *expr_local;
  dmr_C *C_local;
  
  expr_00 = (expr->field_5).field_3.unop;
  iVar1 = lvalue_expression(C,expr_00);
  if (iVar1 == 0) {
    dmrC_expression_error(C,expr,"not an lvalue");
    C_local = (dmr_C *)0x0;
  }
  else {
    C_local = (dmr_C *)expr_00->ctype;
    if (expr->op == 0x3d) {
      iVar1 = compatible_assignment_types
                        (C,expr,(symbol *)C_local,&(expr->field_5).field_6.right,"assignment");
      if (iVar1 == 0) {
        return (symbol *)0x0;
      }
    }
    else {
      iVar1 = evaluate_assign_op(C,expr);
      if (iVar1 == 0) {
        return (symbol *)0x0;
      }
    }
    evaluate_assign_to(C,expr_00,(symbol *)C_local);
    expr->ctype = (symbol *)C_local;
  }
  return (symbol *)C_local;
}

Assistant:

static struct symbol *evaluate_assignment(struct dmr_C *C, struct expression *expr)
{
	struct expression *left = expr->left;
	struct expression *where = expr;
	struct symbol *ltype;

	if (!lvalue_expression(C, left)) {
		dmrC_expression_error(C, expr, "not an lvalue");
		return NULL;
	}

	ltype = left->ctype;

	if (expr->op != '=') {
		if (!evaluate_assign_op(C, expr))
			return NULL;
	} else {
		if (!compatible_assignment_types(C, where, ltype, &expr->right, "assignment"))
			return NULL;
	}

	evaluate_assign_to(C, left, ltype);

	expr->ctype = ltype;
	return ltype;
}